

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O2

char * __thiscall
cppcms::impl::url_rewriter::rule::rewrite_once(rule *this,cmatch *m,string_pool *pool)

{
  pointer pbVar1;
  size_t sVar2;
  char *__src;
  char *pcVar3;
  pointer piVar4;
  ptrdiff_t _Num_1;
  size_t i;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  char *__dest;
  size_t __n;
  size_t i_1;
  ptrdiff_t _Num;
  value_type local_60;
  value_type local_48;
  
  sVar7 = this->pattern_size;
  for (uVar5 = 0;
      piVar4 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar4 >> 2);
      uVar5 = uVar5 + 1) {
    booster::match_results<const_char_*>::operator[](&local_60,m,piVar4[uVar5]);
    lVar6 = (long)local_60.super_pair<const_char_*,_const_char_*>.second -
            (long)local_60.super_pair<const_char_*,_const_char_*>.first;
    if (local_60.matched == false) {
      lVar6 = 0;
    }
    sVar7 = sVar7 + lVar6;
  }
  pcVar3 = string_pool::alloc(pool,sVar7 + 1);
  lVar6 = 8;
  __dest = pcVar3;
  for (uVar5 = 0;
      piVar4 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar4 >> 2);
      uVar5 = uVar5 + 1) {
    pbVar1 = (this->pattern).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar2 = *(size_t *)((long)&(pbVar1->_M_dataplus)._M_p + lVar6);
    if (sVar2 != 0) {
      memmove(__dest,*(void **)((long)pbVar1 + lVar6 + -8),sVar2);
      piVar4 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    booster::match_results<const_char_*>::operator[](&local_60,m,piVar4[uVar5]);
    __src = local_60.super_pair<const_char_*,_const_char_*>.first;
    booster::match_results<const_char_*>::operator[]
              (&local_48,m,
               (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar5]);
    __n = (long)local_48.super_pair<const_char_*,_const_char_*>.second - (long)__src;
    if (__n != 0) {
      memmove(__dest + sVar2,__src,__n);
    }
    __dest = __dest + sVar2 + __n;
    lVar6 = lVar6 + 0x20;
  }
  pbVar1 = (this->pattern).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  sVar2 = pbVar1[-1]._M_string_length;
  if (sVar2 != 0) {
    memmove(__dest,pbVar1[-1]._M_dataplus._M_p,sVar2);
  }
  __dest[sVar2] = '\0';
  return pcVar3;
}

Assistant:

char *rewrite_once(booster::cmatch const &m,string_pool &pool) const
		{
			size_t total_size = pattern_size;
			for(size_t i=0;i<index.size();i++) {
				total_size += m[index[i]].length();
			}
			char *new_url = pool.alloc(total_size+1);
			char *ptr = new_url;
			for(size_t i=0;i<index.size();i++) {
				ptr = std::copy(pattern[i].begin(),pattern[i].end(),ptr);
				ptr = std::copy(m[index[i]].first,m[index[i]].second,ptr);
			}
			ptr = std::copy(pattern.back().begin(),pattern.back().end(),ptr);
			*ptr = 0;
			return new_url;
		}